

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::ElementsAreMatcherImpl<char_const(&)[16]>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (ElementsAreMatcherImpl<char_const(&)[16]> *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  MatcherBase<const_char_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_0016c108;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      Matcher<const_char_&>::Matcher((Matcher<const_char_&> *)&MStack_38,first._M_current);
      std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>::
      emplace_back<testing::Matcher<char_const&>>
                ((vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>
                  *)(this + 8),(Matcher<const_char_&> *)&MStack_38);
      first._M_current = first._M_current + 1;
      MatcherBase<const_char_&>::~MatcherBase(&MStack_38);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }